

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

void add_entities_w_info(ecs_world_t *world,ecs_entity_t entity,ecs_entity_info_t *info,
                        ecs_entities_t *components)

{
  ecs_table_t *dst_table_00;
  ecs_table_t *dst_table;
  ecs_table_t *src_table;
  ecs_entities_t added;
  ecs_entity_t buffer [32];
  ecs_entities_t *components_local;
  ecs_entity_info_t *info_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  _ecs_assert(components->count < 0x20,2,(char *)0x0,"components->count < ECS_MAX_ADD_REMOVE",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
              ,0x584);
  if (components->count < 0x20) {
    src_table = (ecs_table_t *)&added.count;
    added.array._0_4_ = 0;
    dst_table_00 = ecs_table_traverse_add(world,info->table,components,(ecs_entities_t *)&src_table)
    ;
    commit(world,entity,info,dst_table_00,(ecs_entities_t *)&src_table,(ecs_entities_t *)0x0);
    return;
  }
  __assert_fail("components->count < (32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x584,
                "void add_entities_w_info(ecs_world_t *, ecs_entity_t, ecs_entity_info_t *, ecs_entities_t *)"
               );
}

Assistant:

static
void add_entities_w_info(
    ecs_world_t * world,
    ecs_entity_t entity,
    ecs_entity_info_t * info,
    ecs_entities_t * components)
{
    ecs_assert(components->count < ECS_MAX_ADD_REMOVE, ECS_INVALID_PARAMETER, NULL);
    ecs_entity_t buffer[ECS_MAX_ADD_REMOVE];
    ecs_entities_t added = { .array = buffer };

    ecs_table_t *src_table = info->table;
    ecs_table_t *dst_table = ecs_table_traverse_add(
        world, src_table, components, &added);

    commit(world, entity, info, dst_table, &added, NULL);
}